

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O1

void __thiscall
fmt::v5::basic_writer<fmt::v5::output_range<std::back_insert_iterator<std::__cxx11::string>,char>>::
write_padded<fmt::v5::basic_writer<fmt::v5::output_range<std::back_insert_iterator<std::__cxx11::string>,char>>::padded_int_writer<fmt::v5::basic_writer<fmt::v5::output_range<std::back_insert_iterator<std::__cxx11::string>,char>>::int_writer<char,fmt::v5::basic_format_specs<char>>::dec_writer>>
          (basic_writer<fmt::v5::output_range<std::back_insert_iterator<std::__cxx11::string>,char>>
           *this,align_spec *spec,
          padded_int_writer<fmt::v5::basic_writer<fmt::v5::output_range<std::back_insert_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_char>_>::int_writer<char,_fmt::v5::basic_format_specs<char>_>::dec_writer>
          *f)

{
  byte bVar1;
  ulong uVar2;
  long *plVar3;
  long lVar4;
  ulong uVar5;
  char __tmp;
  char *pcVar6;
  size_t __len_1;
  ulong __n;
  size_t __len;
  size_t __n_00;
  char __tmp_1;
  char *local_40;
  padded_int_writer<fmt::v5::basic_writer<fmt::v5::output_range<std::back_insert_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_char>_>::int_writer<char,_fmt::v5::basic_format_specs<char>_>::dec_writer>
  *local_38;
  
  uVar5 = (ulong)spec->width_;
  uVar2 = f->size_;
  __n_00 = uVar5 - uVar2;
  if (uVar5 < uVar2 || __n_00 == 0) {
    plVar3 = *(long **)this;
    lVar4 = plVar3[1];
    std::__cxx11::string::resize((ulong)plVar3,(char)uVar2 + (char)lVar4);
    local_40 = (char *)(lVar4 + *plVar3);
    padded_int_writer<fmt::v5::basic_writer<fmt::v5::output_range<std::back_insert_iterator<std::__cxx11::string>,char>>::int_writer<char,fmt::v5::basic_format_specs<char>>::dec_writer>
    ::operator()((padded_int_writer<fmt::v5::basic_writer<fmt::v5::output_range<std::back_insert_iterator<std::__cxx11::string>,char>>::int_writer<char,fmt::v5::basic_format_specs<char>>::dec_writer>
                  *)f,&local_40);
    return;
  }
  plVar3 = *(long **)this;
  lVar4 = plVar3[1];
  local_38 = f;
  std::__cxx11::string::resize((ulong)plVar3,(char)lVar4 + (char)spec->width_);
  local_40 = (char *)(lVar4 + *plVar3);
  bVar1 = (byte)spec->fill_;
  if (spec->align_ == ALIGN_CENTER) {
    __n = __n_00 >> 1;
    pcVar6 = local_40;
    if (1 < __n_00) {
      pcVar6 = local_40 + __n;
      memset(local_40,(uint)bVar1,__n);
    }
    local_40 = pcVar6;
    padded_int_writer<fmt::v5::basic_writer<fmt::v5::output_range<std::back_insert_iterator<std::__cxx11::string>,char>>::int_writer<char,fmt::v5::basic_format_specs<char>>::dec_writer>
    ::operator()((padded_int_writer<fmt::v5::basic_writer<fmt::v5::output_range<std::back_insert_iterator<std::__cxx11::string>,char>>::int_writer<char,fmt::v5::basic_format_specs<char>>::dec_writer>
                  *)local_38,&local_40);
    if (uVar5 == uVar2) {
      return;
    }
    __n_00 = __n_00 - __n;
  }
  else {
    if (spec->align_ == ALIGN_RIGHT) {
      pcVar6 = local_40;
      if (uVar5 != uVar2) {
        pcVar6 = local_40 + __n_00;
        memset(local_40,(uint)bVar1,__n_00);
      }
      local_40 = pcVar6;
      padded_int_writer<fmt::v5::basic_writer<fmt::v5::output_range<std::back_insert_iterator<std::__cxx11::string>,char>>::int_writer<char,fmt::v5::basic_format_specs<char>>::dec_writer>
      ::operator()((padded_int_writer<fmt::v5::basic_writer<fmt::v5::output_range<std::back_insert_iterator<std::__cxx11::string>,char>>::int_writer<char,fmt::v5::basic_format_specs<char>>::dec_writer>
                    *)local_38,&local_40);
      return;
    }
    padded_int_writer<fmt::v5::basic_writer<fmt::v5::output_range<std::back_insert_iterator<std::__cxx11::string>,char>>::int_writer<char,fmt::v5::basic_format_specs<char>>::dec_writer>
    ::operator()((padded_int_writer<fmt::v5::basic_writer<fmt::v5::output_range<std::back_insert_iterator<std::__cxx11::string>,char>>::int_writer<char,fmt::v5::basic_format_specs<char>>::dec_writer>
                  *)local_38,&local_40);
    if (uVar5 == uVar2) {
      return;
    }
  }
  memset(local_40,(uint)bVar1,__n_00);
  return;
}

Assistant:

void write_padded(const align_spec &spec, F &&f) {
    unsigned width = spec.width(); // User-perceived width (in code points).
    size_t size = f.size(); // The number of code units.
    size_t num_code_points = width != 0 ? f.width() : size;
    if (width <= num_code_points)
      return f(reserve(size));
    auto &&it = reserve(width + (size - num_code_points));
    char_type fill = static_cast<char_type>(spec.fill());
    std::size_t padding = width - num_code_points;
    if (spec.align() == ALIGN_RIGHT) {
      it = std::fill_n(it, padding, fill);
      f(it);
    } else if (spec.align() == ALIGN_CENTER) {
      std::size_t left_padding = padding / 2;
      it = std::fill_n(it, left_padding, fill);
      f(it);
      it = std::fill_n(it, padding - left_padding, fill);
    } else {
      f(it);
      it = std::fill_n(it, padding, fill);
    }
  }